

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int pk_hashlen_helper(mbedtls_md_type_t md_alg,size_t *hash_len)

{
  byte bVar1;
  ulong *in_RSI;
  undefined4 local_4;
  
  if (*in_RSI == 0) {
    bVar1 = mbedtls_md_get_size_from_type(MBEDTLS_MD_NONE);
    *in_RSI = (ulong)bVar1;
    if (*in_RSI == 0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int pk_hashlen_helper(mbedtls_md_type_t md_alg, size_t *hash_len)
{
    if (*hash_len != 0) {
        return 0;
    }

    *hash_len = mbedtls_md_get_size_from_type(md_alg);

    if (*hash_len == 0) {
        return -1;
    }

    return 0;
}